

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString HexStringFrom(char value)

{
  size_t extraout_RDX;
  char in_SIL;
  SimpleString *in_RDI;
  SimpleString SVar2;
  size_t size;
  SimpleString *result;
  SimpleString *this;
  SimpleString *in_stack_ffffffffffffffc8;
  size_t sVar1;
  
  this = in_RDI;
  SVar2 = StringFromFormat((char *)in_RDI,"%x",(ulong)(uint)(int)in_SIL);
  sVar1 = SVar2.bufferSize_;
  if (in_SIL < '\0') {
    SimpleString::size((SimpleString *)0x1127c7);
    SimpleString::subString(in_stack_ffffffffffffffc8,(size_t)this);
    SimpleString::operator=(this,in_RDI);
    SimpleString::~SimpleString((SimpleString *)0x1127ff);
    sVar1 = extraout_RDX;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = (char *)this;
  return SVar2;
}

Assistant:

SimpleString HexStringFrom(signed char value)
{
    SimpleString result = StringFromFormat("%x", value);
    if(value < 0) {
        size_t size = result.size();
        result = result.subString(size-(CPPUTEST_CHAR_BIT/4));
    }
    return result;
}